

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int start_bucketID,int extra_duplication_factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pFVar7;
  self_type *psVar8;
  bool keep_left;
  bool keep_right;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  data_node_type *pdVar14;
  data_node_type *pdVar15;
  long lVar16;
  uint uVar17;
  int left;
  int pos;
  FTNode *tree_node;
  pointer tree_node_00;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = old_node->max_key_;
  tree_node_00 = (used_fanout_tree_nodes->
                 super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  uVar17 = parent->num_children_ - 1;
  auVar23 = vfmadd213sd_fma(auVar23,auVar19,auVar21);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = old_node->min_key_;
  auVar2 = vfmadd231sd_fma(auVar21,auVar19,auVar2);
  uVar9 = ~((int)auVar23._0_8_ >> 0x1f) & (int)auVar23._0_8_;
  if ((int)uVar17 < (int)uVar9) {
    uVar9 = uVar17;
  }
  uVar10 = ~((int)auVar2._0_8_ >> 0x1f) & (int)auVar2._0_8_;
  pdVar14 = old_node->prev_leaf_;
  if ((int)uVar10 <= (int)uVar17) {
    uVar17 = uVar10;
  }
  pFVar7 = (used_fanout_tree_nodes->
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (tree_node_00 != pFVar7) {
    iVar4 = old_node->num_right_out_of_bounds_inserts_;
    iVar18 = 0;
    iVar5 = old_node->num_inserts_;
    iVar6 = old_node->num_left_out_of_bounds_inserts_;
    pdVar15 = pdVar14;
    left = 0;
    do {
      keep_left = false;
      uVar10 = (fanout_tree_depth - tree_node_00->level) + extra_duplication_factor;
      iVar11 = 1 << (uVar10 & 0x1f);
      if ((0.9 < (double)iVar4 / (double)iVar5) && (start_bucketID <= (int)uVar9)) {
        keep_left = (int)uVar9 < iVar11 + start_bucketID;
      }
      if ((double)iVar6 / (double)iVar5 <= 0.9) {
        keep_right = false;
      }
      else {
        keep_right = false;
        if (start_bucketID <= (int)uVar17) {
          keep_right = (int)uVar17 < iVar11 + start_bucketID;
        }
      }
      pos = tree_node_00->right_boundary;
      iVar12 = tree_node_00->num_keys - iVar18;
      tree_node_00->num_keys = iVar12;
      if (pos < old_node->data_capacity_) {
        iVar18 = 0;
        do {
          dVar1 = old_node->key_slots_[pos];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar1;
          if (((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) ||
             (auVar22._8_8_ = 0, auVar22._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_,
             auVar3._8_8_ = 0, auVar3._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_,
             auVar2 = vfmadd213sd_fma(auVar20,auVar22,auVar3),
             iVar11 + start_bucketID <= (int)auVar2._0_8_)) break;
          iVar18 = iVar18 + 1;
          iVar13 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                   ::get_next_filled_position(old_node,pos,false);
          iVar12 = old_node->data_capacity_;
          iVar13 = iVar13 + 1;
          pos = iVar13;
          if (iVar12 < iVar13) {
            pos = iVar12;
          }
        } while (iVar13 < iVar12);
        iVar12 = tree_node_00->num_keys;
      }
      else {
        iVar18 = 0;
      }
      tree_node_00->num_keys = iVar12 + iVar18;
      pdVar14 = bulk_load_leaf_node_from_existing
                          (this,old_node,left,pos,false,tree_node_00,false,keep_left,keep_right);
      (pdVar14->super_AlexNode<double,_double>).level_ =
           (parent->super_AlexNode<double,_double>).level_ + 1;
      (pdVar14->super_AlexNode<double,_double>).cost_ = tree_node_00->cost;
      (pdVar14->super_AlexNode<double,_double>).duplication_factor_ = (uint8_t)uVar10;
      dVar1 = tree_node_00->expected_avg_shifts;
      pdVar14->expected_avg_exp_search_iterations_ = tree_node_00->expected_avg_search_iterations;
      pdVar14->expected_avg_shifts_ = dVar1;
      pdVar14->prev_leaf_ = pdVar15;
      if (pdVar15 != (data_node_type *)0x0) {
        pdVar15->next_leaf_ = pdVar14;
      }
      if ((uVar10 & 0xff) != 0x1f) {
        lVar16 = (long)start_bucketID;
        do {
          parent->children_[lVar16] = &pdVar14->super_AlexNode<double,_double>;
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar11 + start_bucketID);
      }
      tree_node_00 = tree_node_00 + 1;
      pdVar15 = pdVar14;
      left = pos;
      start_bucketID = iVar11 + start_bucketID;
    } while (tree_node_00 != pFVar7);
  }
  psVar8 = old_node->next_leaf_;
  pdVar14->next_leaf_ = psVar8;
  if (psVar8 != (self_type *)0x0) {
    psVar8->prev_leaf_ = pdVar14;
  }
  return;
}

Assistant:

void create_new_data_nodes(
      const data_node_type* old_node, model_node_type* parent,
      int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      int start_bucketID = 0, int extra_duplication_factor = 0) {
    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    // Create the new data nodes
    int cur = start_bucketID;  // first bucket with same child
    data_node_type* prev_leaf =
        old_node->prev_leaf_;  // used for linking the new data nodes
    int left_boundary = 0;
    int right_boundary = 0;
    // Keys may be re-assigned to an adjacent fanout tree node due to off-by-one
    // errors
    int num_reassigned_keys = 0;
    for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
      left_boundary = right_boundary;
      auto duplication_factor = static_cast<uint8_t>(
          fanout_tree_depth - tree_node.level + extra_duplication_factor);
      int child_node_repeats = 1 << duplication_factor;
      bool keep_left = append_mostly_right && cur <= appending_right_bucketID &&
                       appending_right_bucketID < cur + child_node_repeats;
      bool keep_right = append_mostly_left && cur <= appending_left_bucketID &&
                        appending_left_bucketID < cur + child_node_repeats;
      right_boundary = tree_node.right_boundary;
      // Account for off-by-one errors due to floating-point precision issues.
      tree_node.num_keys -= num_reassigned_keys;
      num_reassigned_keys = 0;
      while (right_boundary < old_node->data_capacity_ &&
             old_node->get_key(right_boundary) !=
                 data_node_type::kEndSentinel_ &&
             parent->model_.predict(old_node->get_key(right_boundary)) <
                 cur + child_node_repeats) {
        num_reassigned_keys++;
        right_boundary = std::min(
            old_node->get_next_filled_position(right_boundary, false) + 1,
            old_node->data_capacity_);
      }
      tree_node.num_keys += num_reassigned_keys;
      data_node_type* child_node = bulk_load_leaf_node_from_existing(
          old_node, left_boundary, right_boundary, false, &tree_node, false,
          keep_left, keep_right);
      child_node->level_ = static_cast<short>(parent->level_ + 1);
      child_node->cost_ = tree_node.cost;
      child_node->duplication_factor_ = duplication_factor;
      child_node->expected_avg_exp_search_iterations_ =
          tree_node.expected_avg_search_iterations;
      child_node->expected_avg_shifts_ = tree_node.expected_avg_shifts;
      child_node->prev_leaf_ = prev_leaf;
      if (prev_leaf != nullptr) {
        prev_leaf->next_leaf_ = child_node;
      }
      for (int i = cur; i < cur + child_node_repeats; i++) {
        parent->children_[i] = child_node;
      }
      cur += child_node_repeats;
      prev_leaf = child_node;
    }
    prev_leaf->next_leaf_ = old_node->next_leaf_;
    if (old_node->next_leaf_ != nullptr) {
      old_node->next_leaf_->prev_leaf_ = prev_leaf;
    }
  }